

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMyString.cpp
# Opt level: O3

int Find(CMyString *CS,CMyString *s)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *next;
  uint uVar4;
  
  iVar1 = s->length;
  next = (int *)malloc((long)iVar1 * 4);
  GenKMPNext(next,s);
  if ((long)iVar1 < 1) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    uVar4 = 0;
    do {
      if (CS->length <= iVar3) {
        return -1;
      }
      if (s->str[uVar4] == CS->str[iVar3]) {
        uVar4 = uVar4 + 1;
        iVar3 = iVar3 + 1;
      }
      else {
        uVar2 = next[uVar4];
        uVar4 = 0;
        if (0 < (int)uVar2) {
          uVar4 = uVar2;
        }
        iVar3 = iVar3 - ((int)uVar2 >> 0x1f);
      }
    } while ((int)uVar4 < iVar1);
  }
  return iVar3 - iVar1;
}

Assistant:

int Find(CMyString *CS,CMyString *s)  //在本字符串中查找字符串s首次出现的位置，如果不包含s则返回0
{
    int i,j,*next = (int *)malloc(sizeof(int)*s->length);
    //构造模式s的next数组，详见求next数组的算法
    GenKMPNext(next,s);
    for(i = 0, j = 0; i<s->length && j<CS->length; )
    {
        if(s->str[i]==CS->str[j])
        {
            i++;
            j++;
        }
        else if(next[i]>=0)
            i = next[i];
        else
        {
            i = 0;
            j++;
        }
    }
    if(i >= s->length)
        return j-(s->length);  //匹配成功，返回子串的起始位置
    else
        return -1;  //匹配失败，返回-1
}